

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborstreamreader.h
# Opt level: O0

QString * __thiscall QCborStreamReader::readAllString(QCborStreamReader *this)

{
  long lVar1;
  bool bVar2;
  QCborStreamReader *in_RDI;
  long in_FS_OFFSET;
  QString *dst;
  QString *in_stack_ffffffffffffff98;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)&in_RDI->type_ = &DAT_aaaaaaaaaaaaaaaa;
  in_RDI->value64 = (quint64)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d)._M_t.
  super___uniq_ptr_impl<QCborStreamReaderPrivate,_std::default_delete<QCborStreamReaderPrivate>_>.
  _M_t.
  super__Tuple_impl<0UL,_QCborStreamReaderPrivate_*,_std::default_delete<QCborStreamReaderPrivate>_>
  .super__Head_base<0UL,_QCborStreamReaderPrivate_*,_false>._M_head_impl =
       (QCborStreamReaderPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QString::QString((QString *)0x4504c9);
  bVar2 = readAndAppendToString(in_RDI,in_stack_ffffffffffffff98);
  if (!bVar2) {
    QString::QString((QString *)0x4504f2);
    QString::operator=((QString *)in_RDI,in_stack_ffffffffffffff98);
    QString::~QString((QString *)0x45050b);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QString *)in_RDI;
}

Assistant:

QString readAllString()
    {
        QString dst;
        if (!readAndAppendToString(dst))
            dst = QString{};
        return dst;
    }